

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

int float16_is_quiet_nan_x86_64(float16 a_,float_status *status)

{
  flag fVar1;
  bool local_1b;
  uint16_t a;
  float_status *status_local;
  float16 a__local;
  
  fVar1 = snan_bit_is_one(status);
  if (fVar1 == '\0') {
    local_1b = 0x7c7f < (a_ & 0x7fff);
  }
  else {
    local_1b = ((int)(uint)a_ >> 9 & 0x3fU) == 0x3e && (a_ & 0x1ff) != 0;
  }
  status_local._4_4_ = (uint)local_1b;
  return status_local._4_4_;
}

Assistant:

int float16_is_quiet_nan(float16 a_, float_status *status)
{
#ifdef NO_SIGNALING_NANS
    return float16_is_any_nan(a_);
#else
    uint16_t a = float16_val(a_);
    if (snan_bit_is_one(status)) {
        return (((a >> 9) & 0x3F) == 0x3E) && (a & 0x1FF);
    } else {
        return ((a & ~0x8000) >= 0x7C80);
    }
#endif
}